

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

void __thiscall ncnn::Convolution_x86::destroy_pipeline(Convolution_x86 *this)

{
  Option *in_stack_00000038;
  Convolution_x86 *in_stack_00000040;
  
  destroy_pipeline(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

int Convolution_x86::destroy_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    if (activation)
    {
        activation->destroy_pipeline(opt_cpu);
        delete activation;
        activation = 0;
    }

    return 0;
}